

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_print(lua_State *L)

{
  long lVar1;
  long lVar2;
  cTValue *pcVar3;
  undefined4 *puVar4;
  long lVar5;
  uint uVar6;
  long in_RDI;
  MSize len;
  size_t size;
  char *str;
  cTValue *o;
  int shortcut;
  cTValue *tv;
  ptrdiff_t nargs;
  ptrdiff_t i;
  int in_stack_fffffffffffffeb8;
  ErrMsg in_stack_fffffffffffffebc;
  uint in_stack_fffffffffffffec0;
  uint uVar7;
  uint in_stack_fffffffffffffec4;
  cTValue *in_stack_fffffffffffffec8;
  lua_State *in_stack_fffffffffffffed0;
  cTValue *local_118;
  long local_108;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  lVar2 = *(long *)(in_RDI + 0x10);
  local_118 = lj_tab_getstr((GCtab *)(ulong)*(uint *)(in_RDI + 0x2c),
                            (GCstr *)(ulong)*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8
                                                                      ) + 0x20));
  if ((local_118 == (cTValue *)0x0) || ((local_118->field_2).it == 0xffffffff)) {
    puVar4 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar4 + 2;
    *puVar4 = *(undefined4 *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -8) + 0x20);
    puVar4[1] = 0xfffffffb;
    lua_gettable((lua_State *)&in_stack_fffffffffffffec8->field_2,in_stack_fffffffffffffec4);
    local_118 = (cTValue *)(*(long *)(in_RDI + 0x18) + -8);
  }
  else {
    pcVar3 = *(cTValue **)(in_RDI + 0x18);
    *(cTValue **)(in_RDI + 0x18) = pcVar3 + 1;
    pcVar3->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)local_118;
  }
  uVar7 = in_stack_fffffffffffffec0 & 0xffffff;
  if (((local_118->field_2).it == 0xfffffff7) &&
     (uVar7 = in_stack_fffffffffffffec0 & 0xffffff,
     *(char *)((ulong)(local_118->u32).lo + 6) == '\x12')) {
    uVar7 = CONCAT13(*(int *)((ulong)*(uint *)(in_RDI + 8) + 0x224) != 0,
                     (int3)in_stack_fffffffffffffec0) ^ 0xff000000;
  }
  uVar6 = uVar7 & 0x1000000;
  local_108 = 0;
  do {
    if (lVar1 - lVar2 >> 3 <= local_108) {
      putchar(10);
      return 0;
    }
    lVar5 = *(long *)(in_RDI + 0x10);
    if (uVar6 == 0) {
LAB_0012c34c:
      *(undefined8 *)(*(long *)(in_RDI + 0x18) + 8) = *(undefined8 *)(lVar5 + local_108 * 8);
      **(undefined8 **)(in_RDI + 0x18) = *(undefined8 *)(*(long *)(in_RDI + 0x18) + -8);
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x10;
      lua_call((lua_State *)CONCAT44(in_stack_fffffffffffffec4,uVar7),in_stack_fffffffffffffebc,
               in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffed0 =
           (lua_State *)
           lua_tolstring(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                         (size_t *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
      if (in_stack_fffffffffffffed0 == (lua_State *)0x0) {
        lj_err_caller((lua_State *)CONCAT44(in_stack_fffffffffffffec4,uVar7),
                      in_stack_fffffffffffffebc);
      }
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -8;
    }
    else {
      in_stack_fffffffffffffed0 =
           (lua_State *)
           lj_strfmt_wstrnum(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                             (MSize *)CONCAT44(in_stack_fffffffffffffec4,uVar7));
      if (in_stack_fffffffffffffed0 == (lua_State *)0x0) goto LAB_0012c34c;
      in_stack_fffffffffffffec8 = (cTValue *)(ulong)in_stack_fffffffffffffec4;
    }
    if (local_108 != 0) {
      putchar(9);
    }
    fwrite(in_stack_fffffffffffffed0,1,(size_t)in_stack_fffffffffffffec8,_stdout);
    local_108 = local_108 + 1;
  } while( true );
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring)
	      && !gcrefu(basemt_it(G(L), LJ_TNUMX));
  for (i = 0; i < nargs; i++) {
    cTValue *o = &L->base[i];
    const char *str;
    size_t size;
    MSize len;
    if (shortcut && (str = lj_strfmt_wstrnum(L, o, &len)) != NULL) {
      size = len;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}